

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDie::attribute_iterator::attribute_iterator(attribute_iterator *this,DWARFDie D,bool End)

{
  DWARFAbbreviationDeclaration *AbbrDecl;
  DWARFDebugInfoEntry *pDVar1;
  
  pDVar1 = D.Die;
  (this->Die).U = D.U;
  (this->Die).Die = pDVar1;
  (this->AttrValue).Offset = 0;
  (this->AttrValue).ByteSize = 0;
  (this->AttrValue).Attr = 0;
  (this->AttrValue).Value.Form = 0;
  (this->AttrValue).Value.Value.field_0.uval = 0;
  (this->AttrValue).Value.Value.data = (uint8_t *)0x0;
  (this->AttrValue).Value.U = (DWARFUnit *)0x0;
  (this->AttrValue).Value.C = (DWARFContext *)0x0;
  this->Index = 0;
  AbbrDecl = getAbbreviationDeclarationPtr(&this->Die);
  if (AbbrDecl == (DWARFAbbreviationDeclaration *)0x0) {
    __assert_fail("AbbrDecl && \"Must have abbreviation declaration\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                  ,0x2a2,"llvm::DWARFDie::attribute_iterator::attribute_iterator(DWARFDie, bool)");
  }
  if (End) {
    this->Index = (AbbrDecl->AttributeSpecs).
                  super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                  super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                  .
                  super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                  .super_SmallVectorBase.Size;
    return;
  }
  if ((D.U != (DWARFUnit *)0x0) && (pDVar1 != (DWARFDebugInfoEntry *)0x0)) {
    (this->AttrValue).Offset = (ulong)AbbrDecl->CodeByteSize + pDVar1->Offset;
    updateForIndex(this,AbbrDecl,0);
    return;
  }
  __assert_fail("isValid() && \"must check validity prior to calling\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                ,0x43,"uint64_t llvm::DWARFDie::getOffset() const");
}

Assistant:

DWARFDie::attribute_iterator::attribute_iterator(DWARFDie D, bool End)
    : Die(D), Index(0) {
  auto AbbrDecl = Die.getAbbreviationDeclarationPtr();
  assert(AbbrDecl && "Must have abbreviation declaration");
  if (End) {
    // This is the end iterator so we set the index to the attribute count.
    Index = AbbrDecl->getNumAttributes();
  } else {
    // This is the begin iterator so we extract the value for this->Index.
    AttrValue.Offset = D.getOffset() + AbbrDecl->getCodeByteSize();
    updateForIndex(*AbbrDecl, 0);
  }
}